

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.hpp
# Opt level: O2

string * __thiscall
duckdb::CSVRejectsTable::GetObjectType_abi_cxx11_
          (string *__return_storage_ptr__,CSVRejectsTable *this)

{
  ObjectType_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

string GetObjectType() override {
		return ObjectType();
	}